

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_ledb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  DisasJumpType DVar1;
  TCGv_i32 pTVar2;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  TCGTemp *local_28;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar2 = fpinst_extract_m34(s,true,true);
  if (pTVar2 == (TCGv_i32)0x0) {
    DVar1 = DISAS_NORETURN;
  }
  else {
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = o->in2 + (long)tcg_ctx;
    local_28 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_s390x(tcg_ctx,helper_ledb,(TCGTemp *)(o->out + (long)tcg_ctx),3,&local_38);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    DVar1 = DISAS_NEXT;
  }
  return DVar1;
}

Assistant:

static DisasJumpType op_ledb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m34 = fpinst_extract_m34(s, true, true);

    if (!m34) {
        return DISAS_NORETURN;
    }
    gen_helper_ledb(tcg_ctx, o->out, tcg_ctx->cpu_env, o->in2, m34);
    tcg_temp_free_i32(tcg_ctx, m34);
    return DISAS_NEXT;
}